

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileStatic(jx9_gen_state *pGen)

{
  sxu32 nLine_00;
  char *pcVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  SySet *pContainer;
  bool bVar4;
  SySet *pInstrContainer;
  sxi32 rc;
  sxu32 nLine;
  char *zDup;
  SyString *pName;
  GenBlock *pBlock;
  jx9_vm_func *pFunc;
  jx9_vm_func_static_var sStatic;
  jx9_gen_state *pGen_local;
  
  nLine_00 = pGen->pIn->nLine;
  pGen->pIn = pGen->pIn + 1;
  pName = (SyString *)pGen->pCurrent;
  while ((pName != (SyString *)0x0 && (((ulong)pName[1].zString & 0x800000000) == 0))) {
    pName = *(SyString **)&pName->nByte;
  }
  sStatic._56_8_ = pGen;
  if (pName == (SyString *)0x0) {
    if ((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x10) != 0)) {
      sVar3 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      if (sVar3 == -10) {
        return -10;
      }
      if (sVar3 != -3) {
        jx9VmEmitInstr(*(jx9_vm **)sStatic._56_8_,0xb,1,0,(void *)0x0,(sxu32 *)0x0);
      }
      return 0;
    }
    sVar3 = jx9GenCompileError(pGen,1,nLine_00,"Expected variable after \'static\' keyword");
    if (sVar3 == -10) {
      return -10;
    }
  }
  else {
    pcVar1 = pName[4].zString;
    if ((((pGen->pIn < pGen->pEnd) && ((pGen->pIn->nType & 0x10) != 0)) &&
        (pGen->pIn + 1 < pGen->pEnd)) && ((pGen->pIn[1].nType & 0xc) != 0)) {
      pGen->pIn = pGen->pIn + 1;
      pSVar2 = pGen->pIn;
      pGen->pIn = pGen->pIn + 1;
      if ((pGen->pEnd <= pGen->pIn) || ((pGen->pIn->nType & 0x440000) != 0)) {
        SySetInit((SySet *)&sStatic.sName.nByte,&pGen->pVm->sAllocator,0x18);
        sStatic.aByteCode.pUserData._0_4_ = 0xffffffff;
        pFunc = (jx9_vm_func *)
                SyMemBackendStrDup(*(SyMemBackend **)sStatic._56_8_,(pSVar2->sData).zString,
                                   (pSVar2->sData).nByte);
        if (pFunc == (jx9_vm_func *)0x0) {
          jx9GenCompileError((jx9_gen_state *)sStatic._56_8_,1,nLine_00,
                             "Fatal, JX9 engine is running out of memory");
          return -10;
        }
        sStatic.sName.zString._0_4_ = (pSVar2->sData).nByte;
        if ((*(ulong *)(sStatic._56_8_ + 0x158) < *(ulong *)(sStatic._56_8_ + 0x160)) &&
           ((*(uint *)(*(long *)(sStatic._56_8_ + 0x158) + 0x10) & 0x400000) != 0)) {
          *(long *)(sStatic._56_8_ + 0x158) = *(long *)(sStatic._56_8_ + 0x158) + 0x20;
          pContainer = jx9VmGetByteCodeContainer(*(jx9_vm **)sStatic._56_8_);
          jx9VmSetByteCodeContainer(*(jx9_vm **)sStatic._56_8_,(SySet *)&sStatic.sName.nByte);
          sVar3 = jx9CompileExpr((jx9_gen_state *)sStatic._56_8_,0,
                                 (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
          jx9VmEmitInstr(*(jx9_vm **)sStatic._56_8_,1,(uint)(sVar3 != -3),0,(void *)0x0,(sxu32 *)0x0
                        );
          jx9VmSetByteCodeContainer(*(jx9_vm **)sStatic._56_8_,pContainer);
        }
        SySetPut((SySet *)(pcVar1 + 0x28),&pFunc);
        return 0;
      }
      jx9GenCompileError(pGen,1,pGen->pIn->nLine,"static: Unexpected token \'%z\'",pGen->pIn);
    }
    else {
      sVar3 = jx9GenCompileError(pGen,1,nLine_00,"Expected variable after \'static\' keyword");
      if (sVar3 == -10) {
        return -10;
      }
    }
  }
  while( true ) {
    bVar4 = false;
    if (*(ulong *)(sStatic._56_8_ + 0x158) < *(ulong *)(sStatic._56_8_ + 0x160)) {
      bVar4 = (*(uint *)(*(long *)(sStatic._56_8_ + 0x158) + 0x10) & 0x40000) == 0;
    }
    if (!bVar4) break;
    *(long *)(sStatic._56_8_ + 0x158) = *(long *)(sStatic._56_8_ + 0x158) + 0x20;
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileStatic(jx9_gen_state *pGen)
{
	jx9_vm_func_static_var sStatic; /* Structure describing the static variable */
	jx9_vm_func *pFunc;             /* Enclosing function */
	GenBlock *pBlock;
	SyString *pName;
	char *zDup;
	sxu32 nLine;
	sxi32 rc;
	/* Jump the static keyword */
	nLine = pGen->pIn->nLine;
	pGen->pIn++;
	/* Extract the enclosing function if any */
	pBlock = pGen->pCurrent;
	while( pBlock ){
		if( pBlock->iFlags & GEN_BLOCK_FUNC){
			break;
		}
		/* Point to the upper block */
		pBlock = pBlock->pParent;
	}
	if( pBlock == 0 ){
		/* Static statement, called outside of a function body, treat it as a simple variable. */
		if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_DOLLAR) == 0 ){
			rc = jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Expected variable after 'static' keyword");
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			goto Synchronize;
		}
		/* Compile the expression holding the variable */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}else if( rc != SXERR_EMPTY ){
			/* Emit the POP instruction */
			jx9VmEmitInstr(pGen->pVm, JX9_OP_POP, 1, 0, 0, 0);
		}
		return SXRET_OK;
	}
	pFunc = (jx9_vm_func *)pBlock->pUserData;
	/* Make sure we are dealing with a valid statement */
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_DOLLAR) == 0 || &pGen->pIn[1] >= pGen->pEnd ||
		(pGen->pIn[1].nType & (JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
			rc = jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Expected variable after 'static' keyword");
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			goto Synchronize;
	}
	pGen->pIn++;
	/* Extract variable name */
	pName = &pGen->pIn->sData;
	pGen->pIn++; /* Jump the var name */
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI/*';'*/|JX9_TK_EQUAL/*'='*/)) == 0 ){
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "static: Unexpected token '%z'", &pGen->pIn->sData);
		goto Synchronize;
	}
	/* Initialize the structure describing the static variable */
	SySetInit(&sStatic.aByteCode, &pGen->pVm->sAllocator, sizeof(VmInstr));
	sStatic.nIdx = SXU32_HIGH; /* Not yet created */
	/* Duplicate variable name */
	zDup = SyMemBackendStrDup(&pGen->pVm->sAllocator, pName->zString, pName->nByte);
	if( zDup == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, nLine, "Fatal, JX9 engine is running out of memory");
		return SXERR_ABORT;
	}
	SyStringInitFromBuf(&sStatic.sName, zDup, pName->nByte);
	/* Check if we have an expression to compile */
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_EQUAL) ){
		SySet *pInstrContainer;
		pGen->pIn++; /* Jump the equal '=' sign */
		/* Swap bytecode container */
		pInstrContainer = jx9VmGetByteCodeContainer(pGen->pVm);
		jx9VmSetByteCodeContainer(pGen->pVm, &sStatic.aByteCode);
		/* Compile the expression */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		/* Emit the done instruction */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_DONE, (rc != SXERR_EMPTY ? 1 : 0), 0, 0, 0);
		/* Restore default bytecode container */
		jx9VmSetByteCodeContainer(pGen->pVm, pInstrContainer);
	}
	/* Finally save the compiled static variable in the appropriate container */
	SySetPut(&pFunc->aStatic, (const void *)&sStatic);
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';', so we can avoid compiling this erroneous
	 * statement. 
	 */
	while(pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) ==  0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}